

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O1

void __thiscall
jaegertracing::samplers::Config::Config
          (Config *this,string *type,double param,string *samplingServerURL,int maxOperations,
          duration *samplingRefreshInterval)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  
  sVar1 = type->_M_string_length;
  (this->_type)._M_dataplus._M_p = (pointer)&(this->_type).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)this,"remote","");
  }
  else {
    pcVar2 = (type->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + sVar1);
  }
  this->_param = (double)(~-(ulong)(param == -1.0) & (ulong)param |
                         -(ulong)(param == -1.0) & 0x3f50624dd2f1a9fc);
  sVar1 = samplingServerURL->_M_string_length;
  (this->_samplingServerURL)._M_dataplus._M_p = (pointer)&(this->_samplingServerURL).field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&this->_samplingServerURL,"http://127.0.0.1:5778/sampling","");
  }
  else {
    pcVar2 = (samplingServerURL->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this->_samplingServerURL,pcVar2,pcVar2 + sVar1);
  }
  iVar3 = 2000;
  if (maxOperations != 0) {
    iVar3 = maxOperations;
  }
  this->_maxOperations = iVar3;
  lVar4 = 60000000000;
  if (0 < samplingRefreshInterval->__r) {
    lVar4 = samplingRefreshInterval->__r;
  }
  (this->_samplingRefreshInterval).__r = lVar4;
  return;
}

Assistant:

explicit Config(
        const std::string& type = kSamplerTypeRemote,
        double param = kDefaultSamplingProbability,
        const std::string& samplingServerURL = kDefaultSamplingServerURL,
        int maxOperations = kDefaultMaxOperations,
        const Clock::duration& samplingRefreshInterval =
            defaultSamplingRefreshInterval())
        : _type(type.empty() ? kSamplerTypeRemote : type)
        , _param(param == -1 ? kDefaultSamplingProbability : param)
        , _samplingServerURL(samplingServerURL.empty()
                                 ? kDefaultSamplingServerURL
                                 : samplingServerURL)
        , _maxOperations(maxOperations == 0 ? kDefaultMaxOperations
                                            : maxOperations)
        , _samplingRefreshInterval(samplingRefreshInterval.count() > 0
                                       ? samplingRefreshInterval
                                       : defaultSamplingRefreshInterval())
    {
    }